

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O1

Id __thiscall
dxil_spv::SPIRVModule::Impl::build_wave_multi_prefix_op
          (Impl *this,SPIRVModule *module,Op opcode,Id type_id)

{
  Vector<std::unique_ptr<Instruction>_> *pVVar1;
  vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *pvVar2;
  Set<spv::Capability> *this_00;
  pointer *ppMVar3;
  uint uVar4;
  pointer ppIVar5;
  iterator iVar6;
  iterator __position;
  bool bVar7;
  bool bVar8;
  Block *thenBlock;
  ulong uVar9;
  Id IVar10;
  Op OVar11;
  Op OVar12;
  Function *pFVar13;
  Block *pBVar14;
  Block *pBVar15;
  Instruction *pIVar16;
  tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_> tVar17;
  Instruction *pIVar18;
  pointer pMVar19;
  char *name;
  Id unaff_EBP;
  Id IVar20;
  Builder *pBVar21;
  Block *entry;
  Id bool_type;
  Vector<spv::Id> types;
  vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  local_138;
  Id local_118;
  Op local_114;
  Builder *local_110;
  Block *local_108;
  Block *local_100;
  Function *local_f8;
  uint local_f0;
  Id local_ec;
  Block *local_e8;
  Block *local_e0;
  Block *local_d8;
  Block *local_d0;
  uint local_c4;
  Id local_c0;
  Id local_bc;
  Block *local_b8;
  ulong local_b0;
  Vector<Id> local_a8;
  Vector<std::unique_ptr<Instruction>_> *local_90;
  Vector<std::unique_ptr<Instruction>_> *local_88;
  Vector<std::unique_ptr<Instruction>_> *local_80;
  Block *local_78;
  __uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_> local_70;
  __uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_> local_68;
  __uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_> local_60;
  __uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_> local_58;
  _Head_base<0UL,_spv::Instruction_*,_false> local_50;
  _Head_base<0UL,_spv::Instruction_*,_false> local_48;
  __uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_> local_40;
  _Head_base<0UL,_spv::Instruction_*,_false> local_38;
  
  for (pMVar19 = (this->wave_multi_prefix_call_ids).
                 super__Vector_base<dxil_spv::SPIRVModule::Impl::MultiPrefixOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::MultiPrefixOp>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      bVar8 = pMVar19 ==
              (this->wave_multi_prefix_call_ids).
              super__Vector_base<dxil_spv::SPIRVModule::Impl::MultiPrefixOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::MultiPrefixOp>_>
              ._M_impl.super__Vector_impl_data._M_finish, !bVar8; pMVar19 = pMVar19 + 1) {
    bVar7 = true;
    if ((pMVar19->opcode == opcode) && (pMVar19->type_id == type_id)) {
      unaff_EBP = pMVar19->func_id;
      bVar7 = false;
    }
    if (!bVar7) break;
  }
  if (bVar8) {
    pBVar21 = &this->builder;
    local_78 = (this->builder).buildPoint;
    local_100 = (Block *)0x0;
    IVar10 = spv::Builder::makeIntegerType(pBVar21,0x20,false);
    IVar10 = spv::Builder::makeVectorType(pBVar21,IVar10,4);
    local_ec = spv::Builder::makeBoolType(pBVar21);
    local_c0 = spv::Builder::makeVectorType(pBVar21,local_ec,4);
    local_a8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)allocate_in_thread(8);
    local_a8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_finish =
         local_a8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_start + 2;
    *local_a8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
     _M_impl.super__Vector_impl_data._M_start = type_id;
    local_a8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[1] = IVar10;
    local_118 = IVar10;
    local_a8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage =
         local_a8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (this->helper_lanes_participate_in_wave_ops == false) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&local_a8,
                 (iterator)
                 local_a8.
                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_ec);
    }
    if (opcode - OpGroupNonUniformIAdd < 0xd) {
      name = &DAT_001ca508 + *(int *)(&DAT_001ca508 + (ulong)(opcode - OpGroupNonUniformIAdd) * 4);
    }
    else {
      name = "";
    }
    local_138.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_138.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_138.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b0 = (ulong)opcode;
    pFVar13 = spv::Builder::makeFunctionEntry
                        (pBVar21,DecorationMax,type_id,name,&local_a8,&local_138,&local_100);
    std::
    vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ::~vector(&local_138);
    ppIVar5 = (pFVar13->parameterInstructions).
              super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_f0 = (*ppIVar5)->resultId;
    local_c4 = ppIVar5[1]->resultId;
    local_110 = pBVar21;
    local_bc = type_id;
    local_114 = spv::Builder::createUndefined(pBVar21,type_id);
    local_d0 = (Block *)allocate_in_thread(0x78);
    IVar10 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar10;
    local_d0->_vptr_Block = (_func_int **)&PTR__Block_001f8cc8;
    pVVar1 = &local_d0->instructions;
    (local_d0->instructions).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_d0->instructions).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_d0->instructions).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_d0->predecessors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (local_d0->predecessors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_d0->predecessors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_d0->successors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (local_d0->successors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_d0->successors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_d0->localVariables).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_d0->localVariables).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_d0->localVariables).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_d0->parent = pFVar13;
    local_d0->unreachable = false;
    local_f8 = pFVar13;
    local_138.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)allocate_in_thread(0x38);
    *(undefined ***)
     &(local_138.
       super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->field_0x0 = &PTR__Instruction_001f81e0;
    *(Id *)(local_138.
            super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start + 8) = IVar10;
    *(undefined8 *)
     (local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start + 0xc) = 0xf800000000;
    *(undefined8 *)
     (local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start + 0x18) = 0;
    *(undefined8 *)
     (local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start + 0x20) = 0;
    *(undefined8 *)
     (local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start + 0x28) = 0;
    *(undefined8 *)
     (local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start + 0x30) = 0;
    std::
    vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
    ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
              ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                *)pVVar1,
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_138);
    if (local_138.
        super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)&(local_138.
                              super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->field_0x0 + 8))();
    }
    pFVar13 = local_f8;
    ((local_d0->instructions).
     super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
     ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
     super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
     super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
     super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl)->block = local_d0;
    spv::Module::mapInstruction
              (local_f8->parent,
               (local_d0->instructions).
               super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
               super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
               super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl);
    pBVar14 = (Block *)allocate_in_thread(0x78);
    IVar10 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar10;
    pBVar14->_vptr_Block = (_func_int **)&PTR__Block_001f8cc8;
    (pBVar14->instructions).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pBVar14->instructions).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pBVar14->instructions).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pBVar14->predecessors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pBVar14->predecessors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pBVar14->predecessors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pBVar14->successors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pBVar14->successors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pBVar14->successors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pBVar14->localVariables).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pBVar14->localVariables).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pBVar14->localVariables).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pBVar14->parent = pFVar13;
    pBVar14->unreachable = false;
    local_138.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)allocate_in_thread(0x38);
    *(undefined ***)
     &(local_138.
       super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->field_0x0 = &PTR__Instruction_001f81e0;
    *(Id *)(local_138.
            super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start + 8) = IVar10;
    *(undefined8 *)
     (local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start + 0xc) = 0xf800000000;
    *(undefined8 *)
     (local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start + 0x18) = 0;
    *(undefined8 *)
     (local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start + 0x20) = 0;
    *(undefined8 *)
     (local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start + 0x28) = 0;
    *(undefined8 *)
     (local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start + 0x30) = 0;
    local_80 = &pBVar14->instructions;
    std::
    vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
    ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
              ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                *)&pBVar14->instructions,
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_138);
    if (local_138.
        super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)&(local_138.
                              super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->field_0x0 + 8))();
    }
    ((pBVar14->instructions).
     super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
     ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
     super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
     super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
     super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl)->block = pBVar14;
    spv::Module::mapInstruction
              (pFVar13->parent,
               (pBVar14->instructions).
               super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
               super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
               super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl);
    local_d8 = (Block *)allocate_in_thread(0x78);
    IVar10 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar10;
    local_d8->_vptr_Block = (_func_int **)&PTR__Block_001f8cc8;
    pVVar1 = &local_d8->instructions;
    (local_d8->instructions).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_d8->instructions).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_d8->instructions).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_d8->predecessors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (local_d8->predecessors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_d8->predecessors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_d8->successors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (local_d8->successors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_d8->successors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_d8->localVariables).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_d8->localVariables).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_d8->localVariables).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_d8->parent = pFVar13;
    local_d8->unreachable = false;
    local_138.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)allocate_in_thread(0x38);
    *(undefined ***)
     &(local_138.
       super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->field_0x0 = &PTR__Instruction_001f81e0;
    *(Id *)(local_138.
            super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start + 8) = IVar10;
    *(undefined8 *)
     (local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start + 0xc) = 0xf800000000;
    *(undefined8 *)
     (local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start + 0x18) = 0;
    *(undefined8 *)
     (local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start + 0x20) = 0;
    *(undefined8 *)
     (local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start + 0x28) = 0;
    *(undefined8 *)
     (local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start + 0x30) = 0;
    local_90 = pVVar1;
    std::
    vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
    ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
              ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                *)pVVar1,
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_138);
    if (local_138.
        super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)&(local_138.
                              super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->field_0x0 + 8))();
    }
    ((local_d8->instructions).
     super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
     ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
     super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
     super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
     super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl)->block = local_d8;
    spv::Module::mapInstruction
              (pFVar13->parent,
               (local_d8->instructions).
               super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
               super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
               super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl);
    local_e0 = (Block *)allocate_in_thread(0x78);
    IVar10 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar10;
    local_e0->_vptr_Block = (_func_int **)&PTR__Block_001f8cc8;
    pVVar1 = &local_e0->instructions;
    (local_e0->instructions).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_e0->instructions).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_e0->instructions).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_e0->predecessors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (local_e0->predecessors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_e0->predecessors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_e0->successors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (local_e0->successors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_e0->successors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_e0->localVariables).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_e0->localVariables).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_e0->localVariables).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_e0->parent = pFVar13;
    local_e0->unreachable = false;
    local_138.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)allocate_in_thread(0x38);
    *(undefined ***)
     &(local_138.
       super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->field_0x0 = &PTR__Instruction_001f81e0;
    *(Id *)(local_138.
            super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start + 8) = IVar10;
    *(undefined8 *)
     (local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start + 0xc) = 0xf800000000;
    *(undefined8 *)
     (local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start + 0x18) = 0;
    *(undefined8 *)
     (local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start + 0x20) = 0;
    *(undefined8 *)
     (local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start + 0x28) = 0;
    *(undefined8 *)
     (local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start + 0x30) = 0;
    local_88 = pVVar1;
    std::
    vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
    ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
              ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                *)pVVar1,
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_138);
    if (local_138.
        super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)&(local_138.
                              super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->field_0x0 + 8))();
    }
    ((local_e0->instructions).
     super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
     ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
     super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
     super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
     super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl)->block = local_e0;
    spv::Module::mapInstruction
              (pFVar13->parent,
               (local_e0->instructions).
               super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
               super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
               super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl);
    local_e8 = (Block *)allocate_in_thread(0x78);
    IVar10 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar10;
    local_e8->_vptr_Block = (_func_int **)&PTR__Block_001f8cc8;
    pVVar1 = &local_e8->instructions;
    (local_e8->instructions).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_e8->instructions).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_e8->instructions).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_e8->predecessors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (local_e8->predecessors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_e8->predecessors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_e8->successors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (local_e8->successors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_e8->successors).
    super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_e8->localVariables).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_e8->localVariables).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_e8->localVariables).
    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_e8->parent = pFVar13;
    local_e8->unreachable = false;
    local_138.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)allocate_in_thread(0x38);
    *(undefined ***)
     &(local_138.
       super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->field_0x0 = &PTR__Instruction_001f81e0;
    *(Id *)(local_138.
            super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start + 8) = IVar10;
    *(undefined8 *)
     (local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start + 0xc) = 0xf800000000;
    *(undefined8 *)
     (local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start + 0x18) = 0;
    *(undefined8 *)
     (local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start + 0x20) = 0;
    *(undefined8 *)
     (local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start + 0x28) = 0;
    *(undefined8 *)
     (local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start + 0x30) = 0;
    std::
    vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
    ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
              ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                *)pVVar1,
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_138);
    if (local_138.
        super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)&(local_138.
                              super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->field_0x0 + 8))();
    }
    pFVar13 = local_f8;
    ((local_e8->instructions).
     super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
     ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
     super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
     super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
     super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl)->block = local_e8;
    spv::Module::mapInstruction
              (local_f8->parent,
               (local_e8->instructions).
               super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
               super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
               super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl);
    (this->builder).buildPoint = local_100;
    if (this->helper_lanes_participate_in_wave_ops == false) {
      pBVar15 = (Block *)allocate_in_thread(0x78);
      IVar10 = (this->builder).uniqueId + 1;
      (this->builder).uniqueId = IVar10;
      pBVar15->_vptr_Block = (_func_int **)&PTR__Block_001f8cc8;
      (pBVar15->instructions).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pBVar15->instructions).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pBVar15->instructions).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pBVar15->predecessors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pBVar15->predecessors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pBVar15->predecessors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pBVar15->successors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pBVar15->successors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pBVar15->successors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pBVar15->localVariables).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pBVar15->localVariables).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pBVar15->localVariables).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pBVar15->parent = pFVar13;
      pBVar15->unreachable = false;
      local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)allocate_in_thread(0x38);
      *(undefined ***)
       &(local_138.
         super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->field_0x0 = &PTR__Instruction_001f81e0;
      *(Id *)(local_138.
              super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 8) = IVar10;
      *(undefined8 *)
       (local_138.
        super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start + 0xc) = 0xf800000000;
      *(undefined8 *)
       (local_138.
        super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start + 0x18) = 0;
      *(undefined8 *)
       (local_138.
        super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start + 0x20) = 0;
      *(undefined8 *)
       (local_138.
        super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start + 0x28) = 0;
      *(undefined8 *)
       (local_138.
        super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start + 0x30) = 0;
      std::
      vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
      ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
                ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                  *)&pBVar15->instructions,
                 (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_138)
      ;
      if (local_138.
          super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)&(local_138.
                                super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->field_0x0 + 8))();
      }
      pFVar13 = local_f8;
      ((pBVar15->instructions).
       super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
       super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
       super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
       super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl)->block = pBVar15;
      local_108 = pBVar15;
      spv::Module::mapInstruction
                (local_f8->parent,
                 (pBVar15->instructions).
                 super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                 super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
                 super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl);
      pBVar15 = (Block *)allocate_in_thread(0x78);
      IVar10 = (this->builder).uniqueId + 1;
      (this->builder).uniqueId = IVar10;
      pBVar15->_vptr_Block = (_func_int **)&PTR__Block_001f8cc8;
      (pBVar15->instructions).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pBVar15->instructions).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pBVar15->instructions).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pBVar15->predecessors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pBVar15->predecessors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pBVar15->predecessors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pBVar15->successors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pBVar15->successors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pBVar15->successors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pBVar15->localVariables).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pBVar15->localVariables).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pBVar15->localVariables).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pBVar15->parent = pFVar13;
      pBVar15->unreachable = false;
      local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)allocate_in_thread(0x38);
      *(undefined ***)
       &(local_138.
         super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->field_0x0 = &PTR__Instruction_001f81e0;
      *(Id *)(local_138.
              super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 8) = IVar10;
      *(undefined8 *)
       (local_138.
        super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start + 0xc) = 0xf800000000;
      *(undefined8 *)
       (local_138.
        super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start + 0x18) = 0;
      *(undefined8 *)
       (local_138.
        super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start + 0x20) = 0;
      *(undefined8 *)
       (local_138.
        super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start + 0x28) = 0;
      *(undefined8 *)
       (local_138.
        super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start + 0x30) = 0;
      std::
      vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
      ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
                ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                  *)&pBVar15->instructions,
                 (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_138)
      ;
      if (local_138.
          super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)&(local_138.
                                super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->field_0x0 + 8))();
      }
      pFVar13 = local_f8;
      ((pBVar15->instructions).
       super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
       super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
       super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
       super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl)->block = pBVar15;
      spv::Module::mapInstruction
                (local_f8->parent,
                 (pBVar15->instructions).
                 super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                 super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
                 super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl);
      thenBlock = local_108;
      pBVar21 = local_110;
      spv::Builder::createSelectionMerge(local_110,local_108,0);
      spv::Builder::createConditionalBranch
                (pBVar21,(pFVar13->parameterInstructions).
                         super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[2]->resultId,thenBlock,pBVar15);
      local_b8 = local_100;
      (this->builder).buildPoint = pBVar15;
      local_100 = pBVar15;
    }
    else {
      local_108 = (Block *)0x0;
      local_b8 = (Block *)0x0;
      pBVar21 = local_110;
    }
    IVar10 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar10;
    pIVar16 = (Instruction *)allocate_in_thread(0x38);
    pIVar16->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f81e0;
    pIVar16->resultId = IVar10;
    pIVar16->typeId = local_118;
    pIVar16->opCode = OpGroupNonUniformBallot;
    (pIVar16->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pIVar16->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pIVar16->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pIVar16->block = (Block *)0x0;
    IVar10 = spv::Builder::makeIntegerType(pBVar21,0x20,false);
    OVar11 = spv::Builder::makeIntConstant(pBVar21,IVar10,3,false);
    iVar6._M_current =
         (pIVar16->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_138.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_4_ = OVar11;
    if (iVar6._M_current ==
        (pIVar16->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar16->operands,iVar6,(uint *)&local_138);
    }
    else {
      *iVar6._M_current = OVar11;
      (pIVar16->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar6._M_current + 1;
    }
    local_138.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_4_ =
         spv::Builder::makeBoolConstant(local_110,true,false);
    iVar6._M_current =
         (pIVar16->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (pIVar16->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar16->operands,iVar6,(uint *)&local_138);
    }
    else {
      *iVar6._M_current =
           (Op)local_138.
               super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      (pIVar16->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar6._M_current + 1;
    }
    IVar10 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar10;
    tVar17.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
         allocate_in_thread(0x38);
    *(undefined ***)
     tVar17.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
     super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl = &PTR__Instruction_001f81e0;
    *(Id *)((long)tVar17.
                  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                  .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8) = IVar10;
    *(Id *)((long)tVar17.
                  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                  .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0xc) = local_118;
    *(undefined4 *)
     ((long)tVar17.
            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
            super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x10) = 199;
    *(long *)((long)tVar17.
                    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x18) = 0;
    *(long *)((long)tVar17.
                    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) = 0;
    *(long *)((long)tVar17.
                    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x28) = 0;
    *(long *)((long)tVar17.
                    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x30) = 0;
    local_138.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_4_ = pIVar16->resultId;
    iVar6._M_current =
         *(uint **)((long)tVar17.
                          super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20);
    if (iVar6._M_current ==
        *(uint **)((long)tVar17.
                         super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                         .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x28)) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 ((long)tVar17.
                        super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                        .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x18),iVar6
                 ,(uint *)&local_138);
    }
    else {
      *iVar6._M_current =
           (Op)local_138.
               super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(uint **)((long)tVar17.
                       super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                       .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) =
           iVar6._M_current + 1;
    }
    local_138.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_138.
                           super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,local_c4);
    iVar6._M_current =
         *(uint **)((long)tVar17.
                          super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20);
    if (iVar6._M_current ==
        *(uint **)((long)tVar17.
                         super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                         .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x28)) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 ((long)tVar17.
                        super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                        .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x18),iVar6
                 ,(uint *)&local_138);
    }
    else {
      *iVar6._M_current = local_c4;
      *(uint **)((long)tVar17.
                       super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                       .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) =
           iVar6._M_current + 1;
    }
    OVar11 = *(Op *)((long)tVar17.
                           super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                           .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8);
    local_38._M_head_impl = pIVar16;
    add_instruction(this,local_100,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_38);
    if (local_38._M_head_impl != (Instruction *)0x0) {
      (*(local_38._M_head_impl)->_vptr_Instruction[1])();
    }
    local_38._M_head_impl = (Instruction *)0x0;
    local_40._M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
         (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
         (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
         tVar17.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
         super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl;
    add_instruction(this,local_100,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_40);
    if ((_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
        local_40._M_t.
        super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
        super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl != (Instruction *)0x0) {
      (**(code **)(*(long *)local_40._M_t.
                            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                            .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8))();
    }
    pBVar15 = local_d0;
    pBVar21 = local_110;
    local_40._M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
         (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
         (_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)0x0;
    spv::Builder::createBranch(local_110,local_d0);
    (this->builder).buildPoint = pBVar15;
    spv::Builder::createLoopMerge(pBVar21,local_d8,pBVar14,0);
    spv::Builder::createBranch(pBVar21,pBVar14);
    (this->builder).buildPoint = pBVar14;
    IVar10 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar10;
    pIVar16 = (Instruction *)allocate_in_thread(0x38);
    pIVar16->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f81e0;
    pIVar16->resultId = IVar10;
    pIVar16->typeId = local_118;
    pIVar16->opCode = OpGroupNonUniformBroadcastFirst;
    (pIVar16->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pIVar16->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pIVar16->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pIVar16->block = (Block *)0x0;
    IVar10 = spv::Builder::makeIntegerType(pBVar21,0x20,false);
    OVar12 = spv::Builder::makeIntConstant(pBVar21,IVar10,3,false);
    iVar6._M_current =
         (pIVar16->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (pIVar16->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = OVar12;
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar16->operands,iVar6,(uint *)&local_138);
    }
    else {
      *iVar6._M_current = OVar12;
      (pIVar16->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar6._M_current + 1;
    }
    iVar6._M_current =
         (pIVar16->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_138.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_4_ = OVar11;
    if (iVar6._M_current ==
        (pIVar16->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar16->operands,iVar6,(uint *)&local_138);
    }
    else {
      *iVar6._M_current = OVar11;
      (pIVar16->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar6._M_current + 1;
    }
    IVar10 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar10;
    pIVar18 = (Instruction *)allocate_in_thread(0x38);
    pIVar18->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f81e0;
    pIVar18->resultId = IVar10;
    pIVar18->typeId = local_c0;
    pIVar18->opCode = OpIEqual;
    (pIVar18->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pIVar18->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pIVar18->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pIVar18->block = (Block *)0x0;
    iVar6._M_current =
         (pIVar18->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (pIVar18->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = OVar11;
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar18->operands,iVar6,(uint *)&local_138);
    }
    else {
      *iVar6._M_current = OVar11;
      (pIVar18->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar6._M_current + 1;
    }
    local_138.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_4_ = pIVar16->resultId;
    iVar6._M_current =
         (pIVar18->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (pIVar18->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar18->operands,iVar6,(uint *)&local_138);
    }
    else {
      *iVar6._M_current =
           (Op)local_138.
               super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      (pIVar18->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar6._M_current + 1;
    }
    IVar10 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar10;
    tVar17.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
         allocate_in_thread(0x38);
    *(undefined ***)
     tVar17.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
     super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl = &PTR__Instruction_001f81e0;
    *(Id *)((long)tVar17.
                  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                  .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8) = IVar10;
    *(Id *)((long)tVar17.
                  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                  .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0xc) = local_ec;
    *(undefined4 *)
     ((long)tVar17.
            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
            super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x10) = 0x9b;
    *(long *)((long)tVar17.
                    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x28) = 0;
    *(long *)((long)tVar17.
                    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x30) = 0;
    *(long *)((long)tVar17.
                    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x18) = 0;
    *(long *)((long)tVar17.
                    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) = 0;
    local_138.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_138.
                           super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,pIVar18->resultId);
    iVar6._M_current =
         *(uint **)((long)tVar17.
                          super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20);
    if (iVar6._M_current ==
        *(uint **)((long)tVar17.
                         super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                         .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x28)) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 ((long)tVar17.
                        super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                        .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x18),iVar6
                 ,(uint *)&local_138);
    }
    else {
      *iVar6._M_current = pIVar18->resultId;
      *(uint **)((long)tVar17.
                       super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                       .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) =
           iVar6._M_current + 1;
    }
    local_118 = *(Id *)((long)tVar17.
                              super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                              .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8);
    local_48._M_head_impl = pIVar16;
    add_instruction(this,pBVar14,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_48);
    if (local_48._M_head_impl != (Instruction *)0x0) {
      (*(local_48._M_head_impl)->_vptr_Instruction[1])();
    }
    local_48._M_head_impl = (Instruction *)0x0;
    local_50._M_head_impl = pIVar18;
    add_instruction(this,pBVar14,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_50);
    if (local_50._M_head_impl != (Instruction *)0x0) {
      (*(local_50._M_head_impl)->_vptr_Instruction[1])();
    }
    local_50._M_head_impl = (Instruction *)0x0;
    local_58._M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
         (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
         (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
         tVar17.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
         super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl;
    add_instruction(this,pBVar14,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_58);
    uVar9 = local_b0;
    if ((_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
        local_58._M_t.
        super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
        super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl != (Instruction *)0x0) {
      (**(code **)(*(long *)local_58._M_t.
                            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                            .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8))();
    }
    pBVar14 = local_e8;
    pBVar21 = local_110;
    local_58._M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
         (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
         (_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)0x0;
    spv::Builder::createSelectionMerge(local_110,local_e8,0);
    pBVar15 = local_e0;
    spv::Builder::createConditionalBranch(pBVar21,local_118,local_e0,pBVar14);
    (this->builder).buildPoint = pBVar15;
    IVar20 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar20;
    tVar17.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
         allocate_in_thread(0x38);
    IVar10 = local_bc;
    *(undefined ***)
     tVar17.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
     super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl = &PTR__Instruction_001f81e0;
    *(Id *)((long)tVar17.
                  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                  .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8) = IVar20;
    *(Id *)((long)tVar17.
                  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                  .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0xc) = local_bc;
    *(int *)((long)tVar17.
                   super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                   .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x10) =
         (int)uVar9;
    pvVar2 = (vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
             ((long)tVar17.
                    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x18);
    *(long *)((long)tVar17.
                    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x18) = 0;
    *(long *)((long)tVar17.
                    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) = 0;
    *(long *)((long)tVar17.
                    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x28) = 0;
    *(long *)((long)tVar17.
                    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x30) = 0;
    IVar20 = spv::Builder::makeIntegerType(pBVar21,0x20,false);
    OVar11 = spv::Builder::makeIntConstant(pBVar21,IVar20,3,false);
    iVar6._M_current =
         *(uint **)((long)tVar17.
                          super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20);
    if (iVar6._M_current ==
        *(uint **)((long)tVar17.
                         super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                         .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x28)) {
      local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = OVar11;
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>(pvVar2,iVar6,(uint *)&local_138);
    }
    else {
      *iVar6._M_current = OVar11;
      *(uint **)((long)tVar17.
                       super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                       .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) =
           iVar6._M_current + 1;
    }
    uVar4 = local_f0;
    local_138.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_4_ = OpSourceContinued;
    iVar6._M_current =
         *(uint **)((long)tVar17.
                          super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20);
    if (iVar6._M_current ==
        *(uint **)((long)tVar17.
                         super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                         .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x28)) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>(pvVar2,iVar6,(uint *)&local_138);
    }
    else {
      *iVar6._M_current = 2;
      *(uint **)((long)tVar17.
                       super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                       .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) =
           iVar6._M_current + 1;
    }
    local_138.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_138.
                           super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar4);
    iVar6._M_current =
         *(uint **)((long)tVar17.
                          super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20);
    if (iVar6._M_current ==
        *(uint **)((long)tVar17.
                         super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                         .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x28)) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>(pvVar2,iVar6,(uint *)&local_138);
    }
    else {
      *iVar6._M_current = uVar4;
      *(uint **)((long)tVar17.
                       super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                       .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) =
           iVar6._M_current + 1;
    }
    OVar11 = *(Op *)((long)tVar17.
                           super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                           .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8);
    local_60._M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
         (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
         (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
         tVar17.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
         super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl;
    add_instruction(this,local_e0,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_60);
    if ((_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
        local_60._M_t.
        super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
        super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl != (Instruction *)0x0) {
      (**(code **)(*(long *)local_60._M_t.
                            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                            .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8))();
    }
    pBVar14 = local_e8;
    local_60._M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
         (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
         (_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)0x0;
    spv::Builder::createBranch(pBVar21,local_e8);
    (this->builder).buildPoint = pBVar14;
    IVar20 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar20;
    tVar17.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
         allocate_in_thread(0x38);
    *(undefined ***)
     tVar17.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
     super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl = &PTR__Instruction_001f81e0;
    *(Id *)((long)tVar17.
                  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                  .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8) = IVar20;
    *(Id *)((long)tVar17.
                  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                  .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0xc) = IVar10;
    *(undefined4 *)
     ((long)tVar17.
            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
            super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x10) = 0xf5;
    pvVar2 = (vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
             ((long)tVar17.
                    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x18);
    *(long *)((long)tVar17.
                    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x18) = 0;
    *(long *)((long)tVar17.
                    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) = 0;
    *(long *)((long)tVar17.
                    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x28) = 0;
    *(long *)((long)tVar17.
                    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x30) = 0;
    iVar6._M_current =
         *(uint **)((long)tVar17.
                          super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20);
    if (iVar6._M_current ==
        *(uint **)((long)tVar17.
                         super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                         .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x28)) {
      local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = OVar11;
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>(pvVar2,iVar6,(uint *)&local_138);
    }
    else {
      *iVar6._M_current = OVar11;
      *(uint **)((long)tVar17.
                       super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                       .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) =
           iVar6._M_current + 1;
    }
    OVar11 = local_114;
    local_138.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_4_ =
         *(Op *)((long)(((local_88->
                         super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->_M_t).
                       super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                + 8);
    iVar6._M_current =
         *(uint **)((long)tVar17.
                          super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20);
    if (iVar6._M_current ==
        *(uint **)((long)tVar17.
                         super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                         .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x28)) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>(pvVar2,iVar6,(uint *)&local_138);
    }
    else {
      *iVar6._M_current =
           (Op)local_138.
               super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(uint **)((long)tVar17.
                       super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                       .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) =
           iVar6._M_current + 1;
    }
    local_138.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_4_ = OVar11;
    iVar6._M_current =
         *(uint **)((long)tVar17.
                          super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20);
    if (iVar6._M_current ==
        *(uint **)((long)tVar17.
                         super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                         .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x28)) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>(pvVar2,iVar6,(uint *)&local_138);
    }
    else {
      *iVar6._M_current = OVar11;
      *(uint **)((long)tVar17.
                       super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                       .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) =
           iVar6._M_current + 1;
    }
    pBVar14 = local_108;
    uVar4 = *(uint *)((long)(((local_80->
                              super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start)->_M_t).
                            super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                     + 8);
    local_138.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_138.
                           super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar4);
    iVar6._M_current =
         *(uint **)((long)tVar17.
                          super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20);
    if (iVar6._M_current ==
        *(uint **)((long)tVar17.
                         super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                         .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x28)) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>(pvVar2,iVar6,(uint *)&local_138);
    }
    else {
      *iVar6._M_current = uVar4;
      *(uint **)((long)tVar17.
                       super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                       .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) =
           iVar6._M_current + 1;
    }
    OVar11 = *(Op *)((long)tVar17.
                           super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                           .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8);
    local_68._M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
         (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
         (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
         tVar17.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
         super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl;
    add_instruction(this,local_e8,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_68);
    if ((_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
        local_68._M_t.
        super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
        super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl != (Instruction *)0x0) {
      (**(code **)(*(long *)local_68._M_t.
                            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                            .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8))();
    }
    pBVar15 = local_d8;
    pBVar21 = local_110;
    local_68._M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
         (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
         (_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)0x0;
    spv::Builder::createConditionalBranch(local_110,local_118,local_d8,local_d0);
    (this->builder).buildPoint = pBVar15;
    if (pBVar14 != (Block *)0x0) {
      spv::Builder::createBranch(pBVar21,pBVar14);
      (this->builder).buildPoint = pBVar14;
      IVar20 = (this->builder).uniqueId + 1;
      (this->builder).uniqueId = IVar20;
      tVar17.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
           allocate_in_thread(0x38);
      *(undefined ***)
       tVar17.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
       super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl = &PTR__Instruction_001f81e0;
      *(Id *)((long)tVar17.
                    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8) = IVar20;
      *(Id *)((long)tVar17.
                    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0xc) = IVar10;
      *(undefined4 *)
       ((long)tVar17.
              super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
              super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x10) = 0xf5;
      pvVar2 = (vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               ((long)tVar17.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x18);
      *(long *)((long)tVar17.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x18) = 0;
      *(long *)((long)tVar17.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) = 0;
      *(long *)((long)tVar17.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x28) = 0;
      *(long *)((long)tVar17.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x30) = 0;
      iVar6._M_current =
           *(uint **)((long)tVar17.
                            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                            .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20);
      if (iVar6._M_current ==
          *(uint **)((long)tVar17.
                           super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                           .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x28)) {
        local_138.
        super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._0_4_ = OVar11;
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>(pvVar2,iVar6,(uint *)&local_138);
      }
      else {
        *iVar6._M_current = OVar11;
        *(uint **)((long)tVar17.
                         super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                         .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) =
             iVar6._M_current + 1;
      }
      OVar11 = local_114;
      local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ =
           *(Op *)((long)(((local_90->
                           super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->_M_t).
                         super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                  + 8);
      iVar6._M_current =
           *(uint **)((long)tVar17.
                            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                            .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20);
      if (iVar6._M_current ==
          *(uint **)((long)tVar17.
                           super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                           .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x28)) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>(pvVar2,iVar6,(uint *)&local_138);
      }
      else {
        *iVar6._M_current =
             (Op)local_138.
                 super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(uint **)((long)tVar17.
                         super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                         .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) =
             iVar6._M_current + 1;
      }
      local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = OVar11;
      iVar6._M_current =
           *(uint **)((long)tVar17.
                            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                            .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20);
      if (iVar6._M_current ==
          *(uint **)((long)tVar17.
                           super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                           .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x28)) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>(pvVar2,iVar6,(uint *)&local_138);
      }
      else {
        *iVar6._M_current = OVar11;
        *(uint **)((long)tVar17.
                         super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                         .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) =
             iVar6._M_current + 1;
      }
      pBVar14 = local_108;
      uVar4 = *(uint *)((long)(((local_b8->instructions).
                                super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                              super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                              ._M_t + 8);
      local_138.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_138.
                             super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar4);
      iVar6._M_current =
           *(uint **)((long)tVar17.
                            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                            .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20);
      if (iVar6._M_current ==
          *(uint **)((long)tVar17.
                           super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                           .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x28)) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>(pvVar2,iVar6,(uint *)&local_138);
      }
      else {
        *iVar6._M_current = uVar4;
        *(uint **)((long)tVar17.
                         super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                         .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) =
             iVar6._M_current + 1;
      }
      OVar11 = *(Op *)((long)tVar17.
                             super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                             .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8);
      local_70._M_t.
      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
           (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
           (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
           tVar17.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
           .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl;
      add_instruction(this,pBVar14,
                      (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &local_70);
      if ((_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
          local_70._M_t.
          super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
          super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl != (Instruction *)0x0) {
        (**(code **)(*(long *)local_70._M_t.
                              super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                              .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8))()
        ;
      }
      local_70._M_t.
      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
           (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
           (_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)0x0;
      pBVar21 = local_110;
    }
    spv::Builder::makeReturn(pBVar21,false,OVar11);
    (this->builder).buildPoint = local_78;
    local_138.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_4_ = OpCopyMemorySized;
    this_00 = &(this->builder).capabilities;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                *)this_00,(Capability *)&local_138);
    local_138.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_138.
                           super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,0x3f);
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                *)this_00,(Capability *)&local_138);
    pFVar13 = local_f8;
    local_138.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(IVar10,(int)local_b0);
    IVar10 = (local_f8->functionInstruction).resultId;
    local_138.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)CONCAT44(local_138.
                           super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish._4_4_,IVar10);
    __position._M_current =
         (this->wave_multi_prefix_call_ids).
         super__Vector_base<dxil_spv::SPIRVModule::Impl::MultiPrefixOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::MultiPrefixOp>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->wave_multi_prefix_call_ids).
        super__Vector_base<dxil_spv::SPIRVModule::Impl::MultiPrefixOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::MultiPrefixOp>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<dxil_spv::SPIRVModule::Impl::MultiPrefixOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::MultiPrefixOp>_>
      ::_M_realloc_insert<dxil_spv::SPIRVModule::Impl::MultiPrefixOp>
                (&this->wave_multi_prefix_call_ids,__position,(MultiPrefixOp *)&local_138);
    }
    else {
      (__position._M_current)->func_id = IVar10;
      *(pointer *)__position._M_current =
           local_138.
           super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      ppMVar3 = &(this->wave_multi_prefix_call_ids).
                 super__Vector_base<dxil_spv::SPIRVModule::Impl::MultiPrefixOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::MultiPrefixOp>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppMVar3 = *ppMVar3 + 1;
    }
    unaff_EBP = (pFVar13->functionInstruction).resultId;
    if (local_a8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start != (Id *)0x0) {
      free_in_thread(local_a8.
                     super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return unaff_EBP;
}

Assistant:

spv::Id SPIRVModule::Impl::build_wave_multi_prefix_op(SPIRVModule &module, spv::Op opcode, spv::Id type_id)
{
	for (auto &call : wave_multi_prefix_call_ids)
		if (call.opcode == opcode && call.type_id == type_id)
			return call.func_id;

	auto *current_build_point = builder.getBuildPoint();
	spv::Block *entry = nullptr;
	spv::Id uint_type = builder.makeUintType(32);
	spv::Id uvec4_type = builder.makeVectorType(uint_type, 4);
	spv::Id bool_type = builder.makeBoolType();
	spv::Id bvec4_type = builder.makeVectorType(bool_type, 4);

	Vector<spv::Id> types = { type_id, uvec4_type };
	if (!helper_lanes_participate_in_wave_ops)
		types.push_back(bool_type);
	auto *func = builder.makeFunctionEntry(spv::NoPrecision, type_id,
	                                       opcode_to_multi_prefix_name(opcode),
	                                       types, {}, &entry);
	spv::Id value_id = func->getParamId(0);
	spv::Id mask_id = func->getParamId(1);
	spv::Id undef_value = builder.createUndefined(type_id);

	spv::Block *outer_entry = nullptr;
	spv::Block *return_block = nullptr;
	auto *header_block = new spv::Block(builder.getUniqueId(), *func);
	auto *body_block = new spv::Block(builder.getUniqueId(), *func);
	auto *merge_block = new spv::Block(builder.getUniqueId(), *func);
	auto *prefix_block = new spv::Block(builder.getUniqueId(), *func);
	auto *continue_block = new spv::Block(builder.getUniqueId(), *func);

	builder.setBuildPoint(entry);

	if (!helper_lanes_participate_in_wave_ops)
	{
		return_block = new spv::Block(builder.getUniqueId(), *func);
		auto *inner_entry_block = new spv::Block(builder.getUniqueId(), *func);

		builder.createSelectionMerge(return_block, 0);
		builder.createConditionalBranch(func->getParamId(2), return_block, inner_entry_block);
		outer_entry = entry;
		entry = inner_entry_block;
		builder.setBuildPoint(entry);
	}

	{
		auto ballot_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uvec4_type, spv::OpGroupNonUniformBallot);
		ballot_op->addIdOperand(builder.makeUintConstant(spv::ScopeSubgroup));
		ballot_op->addIdOperand(builder.makeBoolConstant(true));
		auto mask_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), uvec4_type, spv::OpBitwiseAnd);
		mask_op->addIdOperand(ballot_op->getResultId());
		mask_op->addIdOperand(mask_id);
		mask_id = mask_op->getResultId();
		add_instruction(entry, std::move(ballot_op));
		add_instruction(entry, std::move(mask_op));
		builder.createBranch(header_block);
	}

	builder.setBuildPoint(header_block);
	{
		builder.createLoopMerge(merge_block, body_block, 0);
		builder.createBranch(body_block);
	}

	builder.setBuildPoint(body_block);
	spv::Id compare_reduce_id;
	{
		auto broadcast_first = std::make_unique<spv::Instruction>(builder.getUniqueId(), uvec4_type, spv::OpGroupNonUniformBroadcastFirst);
		broadcast_first->addIdOperand(builder.makeUintConstant(spv::ScopeSubgroup));
		broadcast_first->addIdOperand(mask_id);

		auto compare = std::make_unique<spv::Instruction>(builder.getUniqueId(), bvec4_type, spv::OpIEqual);
		compare->addIdOperand(mask_id);
		compare->addIdOperand(broadcast_first->getResultId());

		auto compare_reduce = std::make_unique<spv::Instruction>(builder.getUniqueId(), bool_type, spv::OpAll);
		compare_reduce->addIdOperand(compare->getResultId());
		compare_reduce_id = compare_reduce->getResultId();

		add_instruction(body_block, std::move(broadcast_first));
		add_instruction(body_block, std::move(compare));
		add_instruction(body_block, std::move(compare_reduce));
		builder.createSelectionMerge(continue_block, 0);
		builder.createConditionalBranch(compare_reduce_id, prefix_block, continue_block);
	}

	spv::Id result_id;
	builder.setBuildPoint(prefix_block);
	{
		auto prefix_op = std::make_unique<spv::Instruction>(builder.getUniqueId(), type_id, opcode);
		prefix_op->addIdOperand(builder.makeUintConstant(spv::ScopeSubgroup));
		prefix_op->addImmediateOperand(spv::GroupOperationExclusiveScan);
		prefix_op->addIdOperand(value_id);
		result_id = prefix_op->getResultId();
		add_instruction(prefix_block, std::move(prefix_op));
		builder.createBranch(continue_block);
	}

	builder.setBuildPoint(continue_block);
	{
		auto phi = std::make_unique<spv::Instruction>(builder.getUniqueId(), type_id, spv::OpPhi);
		phi->addIdOperand(result_id);
		phi->addIdOperand(prefix_block->getId());
		phi->addIdOperand(undef_value);
		phi->addIdOperand(body_block->getId());
		result_id = phi->getResultId();
		add_instruction(continue_block, std::move(phi));
		builder.createConditionalBranch(compare_reduce_id, merge_block, header_block);
	}

	builder.setBuildPoint(merge_block);

	if (return_block)
	{
		builder.createBranch(return_block);
		builder.setBuildPoint(return_block);

		auto phi = std::make_unique<spv::Instruction>(builder.getUniqueId(), type_id, spv::OpPhi);
		phi->addIdOperand(result_id);
		phi->addIdOperand(merge_block->getId());
		phi->addIdOperand(undef_value);
		phi->addIdOperand(outer_entry->getId());
		result_id = phi->getResultId();
		add_instruction(return_block, std::move(phi));
	}

	builder.makeReturn(false, result_id);

	builder.setBuildPoint(current_build_point);
	builder.addCapability(spv::CapabilityGroupNonUniformBallot);
	builder.addCapability(spv::CapabilityGroupNonUniformArithmetic);
	wave_multi_prefix_call_ids.push_back({ opcode, type_id, func->getId() });
	return func->getId();
}